

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitivesGeneratedQueryObjectQueryCase::iterate
          (PrimitivesGeneratedQueryObjectQueryCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  deBool dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  Enum<int,_2UL> EVar5;
  GetNameFunc local_310;
  int local_308;
  string local_300;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  GLenum local_254;
  GetNameFunc p_Stack_250;
  deUint32 err_2;
  int local_248;
  GetNameFunc local_240;
  int local_238;
  string local_230;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  GLenum local_184;
  GetNameFunc p_Stack_180;
  deUint32 err_1;
  int local_178;
  GetNameFunc local_170;
  int local_168;
  string local_160;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  GLenum local_b4;
  GLuint local_b0;
  deUint32 err;
  GLuint query;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  PrimitivesGeneratedQueryObjectQueryCase *this_local;
  
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar4);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar4,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  local_b0 = 0;
  deqp::gls::StateQueryUtil::verifyStateQueryInteger
            ((ResultCollector *)local_78,this_00,0x8c87,0x8865,0,QUERY_QUERY);
  glu::CallLogWrapper::glGenQueries
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_b0);
  do {
    local_b4 = glu::CallLogWrapper::glGetError
                         ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_b4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"Got Error ",&local_139);
      EVar5 = glu::getErrorStr(local_b4);
      p_Stack_180 = EVar5.m_getName;
      local_178 = EVar5.m_value;
      local_170 = p_Stack_180;
      local_168 = local_178;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_160,&local_170);
      std::operator+(&local_118,&local_138,&local_160);
      std::operator+(&local_f8,&local_118,": ");
      std::operator+(&local_d8,&local_f8,"glGenQueries");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glBeginQuery
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c87,local_b0);
  do {
    local_184 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_184 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Got Error ",&local_209);
      EVar5 = glu::getErrorStr(local_184);
      p_Stack_250 = EVar5.m_getName;
      local_248 = EVar5.m_value;
      local_240 = p_Stack_250;
      local_238 = local_248;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_230,&local_240);
      std::operator+(&local_1e8,&local_208,&local_230);
      std::operator+(&local_1c8,&local_1e8,": ");
      std::operator+(&local_1a8,&local_1c8,"beginQuery");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  deqp::gls::StateQueryUtil::verifyStateQueryInteger
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c87,0x8865,local_b0,QUERY_QUERY);
  glu::CallLogWrapper::glEndQuery((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c87);
  do {
    local_254 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_254 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"Got Error ",&local_2d9);
      EVar5 = glu::getErrorStr(local_254);
      local_310 = EVar5.m_getName;
      local_308 = EVar5.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_300,&local_310);
      std::operator+(&local_2b8,&local_2d8,&local_300);
      std::operator+(&local_298,&local_2b8,": ");
      std::operator+(&local_278,&local_298,"endQuery");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

PrimitivesGeneratedQueryObjectQueryCase::IterateResult PrimitivesGeneratedQueryObjectQueryCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		glw::GLuint query = 0;

		verifyStateQueryInteger(result, gl, GL_PRIMITIVES_GENERATED, GL_CURRENT_QUERY, 0, QUERY_QUERY);

		gl.glGenQueries(1, &query);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenQueries");

		gl.glBeginQuery(GL_PRIMITIVES_GENERATED, query);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "beginQuery");

		verifyStateQueryInteger(result, gl, GL_PRIMITIVES_GENERATED, GL_CURRENT_QUERY, (int)query, QUERY_QUERY);

		gl.glEndQuery(GL_PRIMITIVES_GENERATED);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "endQuery");
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}